

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitemanimation.cpp
# Opt level: O0

qreal __thiscall QGraphicsItemAnimation::verticalScaleAt(QGraphicsItemAnimation *this,qreal step)

{
  char *in_RDI;
  qreal in_XMM0_Qa;
  qreal qVar1;
  qreal in_stack_00000048;
  QList<QGraphicsItemAnimationPrivate::Pair> *in_stack_00000050;
  QGraphicsItemAnimationPrivate *in_stack_00000058;
  qreal in_stack_00000078;
  
  check_step_valid(in_XMM0_Qa,in_RDI);
  qVar1 = QGraphicsItemAnimationPrivate::linearValueForStep
                    (in_stack_00000058,in_stack_00000078,in_stack_00000050,in_stack_00000048);
  return qVar1;
}

Assistant:

qreal QGraphicsItemAnimation::verticalScaleAt(qreal step) const
{
    check_step_valid(step, "verticalScaleAt");

    return d->linearValueForStep(step, d->verticalScale, 1);
}